

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

bool __thiscall testing::TestResult::HasFatalFailure(TestResult *this)

{
  pointer pTVar1;
  uint uVar2;
  pointer pTVar3;
  long in_FS_OFFSET;
  
  pTVar3 = (this->test_part_results_).
           super__Vector_base<testing::TestPartResult,_std::allocator<testing::TestPartResult>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pTVar1 = (this->test_part_results_).
           super__Vector_base<testing::TestPartResult,_std::allocator<testing::TestPartResult>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  uVar2 = 0;
  if (pTVar3 != pTVar1) {
    do {
      uVar2 = uVar2 + (pTVar3->type_ == kFatalFailure);
      pTVar3 = pTVar3 + 1;
    } while (pTVar3 != pTVar1);
    uVar2 = (uint)(uVar2 != 0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(in_FS_OFFSET + 0x28)) {
    return SUB41(uVar2,0);
  }
  __stack_chk_fail();
}

Assistant:

bool TestResult::HasFatalFailure() const {
  return CountIf(test_part_results_, TestPartFatallyFailed) > 0;
}